

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O2

int X509_NAME_cmp(X509_NAME *a,X509_NAME *b)

{
  int iVar1;
  
  if (((a->canon_enc == (uchar *)0x0) || (a->modified != 0)) &&
     (iVar1 = i2d_X509_NAME(a,(uchar **)0x0), iVar1 < 0)) {
    return -2;
  }
  if (((b->canon_enc == (uchar *)0x0) || (b->modified != 0)) &&
     (iVar1 = i2d_X509_NAME(b,(uchar **)0x0), iVar1 < 0)) {
    return -2;
  }
  iVar1 = a->canon_enclen - b->canon_enclen;
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = OPENSSL_memcmp(a->canon_enc,b->canon_enc,(long)a->canon_enclen);
  return iVar1;
}

Assistant:

int X509_NAME_cmp(const X509_NAME *a, const X509_NAME *b) {
  int ret;

  // Ensure canonical encoding is present and up to date

  if (!a->canon_enc || a->modified) {
    ret = i2d_X509_NAME((X509_NAME *)a, NULL);
    if (ret < 0) {
      return -2;
    }
  }

  if (!b->canon_enc || b->modified) {
    ret = i2d_X509_NAME((X509_NAME *)b, NULL);
    if (ret < 0) {
      return -2;
    }
  }

  ret = a->canon_enclen - b->canon_enclen;

  if (ret) {
    return ret;
  }

  return OPENSSL_memcmp(a->canon_enc, b->canon_enc, a->canon_enclen);
}